

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.hpp
# Opt level: O0

vector<unsigned_int,_std::allocator<unsigned_int>_> * read_file_u32(string *file_name)

{
  FILE *__stream;
  long __off;
  long lVar1;
  FILE *__n;
  uint *__ptr;
  FILE *f_00;
  string *in_RSI;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_RDI;
  size_t ret;
  size_t file_size_u32;
  size_t file_size;
  long end;
  long cur;
  FILE *f;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *content;
  char *in_stack_ffffffffffffff58;
  string *in_stack_ffffffffffffff60;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *this;
  string local_40 [32];
  FILE *local_20;
  undefined1 local_11;
  
  local_11 = 0;
  this = in_RDI;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x1944f6);
  std::__cxx11::string::string(local_40,in_RSI);
  __stream = (FILE *)fopen_or_fail(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
  std::__cxx11::string::~string(local_40);
  local_20 = __stream;
  __off = ftell(__stream);
  fseek(local_20,0,2);
  lVar1 = ftell(local_20);
  __n = (FILE *)((ulong)(lVar1 - __off) >> 2);
  if ((lVar1 - __off & 3U) != 0) {
    quit("reading file content failed: file size % 32bit != 0");
  }
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize(this,(size_type)__stream);
  fseek(local_20,__off,0);
  __ptr = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::data
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x194629);
  f_00 = (FILE *)fread(__ptr,4,(size_t)__n,local_20);
  if (f_00 != __n) {
    quit("reading file content failed: %d",f_00);
  }
  fclose_or_fail(f_00);
  return in_RDI;
}

Assistant:

std::vector<uint32_t> read_file_u32(std::string file_name)
{
    std::vector<uint32_t> content;
    auto f = fopen_or_fail(file_name, "rb");
    auto cur = ftell(f);
    fseek(f, 0, SEEK_END);
    auto end = ftell(f);
    size_t file_size = (end - cur);
    size_t file_size_u32 = file_size / sizeof(uint32_t);
    if (file_size % sizeof(uint32_t) != 0) {
        quit("reading file content failed: file size % 32bit != 0");
    }
    content.resize(file_size_u32);
    fseek(f, cur, SEEK_SET);
    size_t ret = fread(content.data(), sizeof(uint32_t), file_size_u32, f);
    if (ret != file_size_u32) {
        quit("reading file content failed: %d", ret);
    }
    fclose_or_fail(f);
    return content;
}